

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateEnumFile
               (FileDescriptor *file,EnumDescriptor *en,bool is_descriptor,
               GeneratorContext *generator_context)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  string *__lhs;
  Descriptor *pDVar2;
  long *in_RCX;
  byte in_DL;
  EnumDescriptor *in_RSI;
  EnumValueDescriptor *value_1;
  int i_1;
  EnumValueDescriptor *value;
  int i;
  int lastindex;
  string fullname;
  Printer printer;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  string filename;
  Printer *in_stack_fffffffffffffd58;
  Printer *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  Printer *in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int iVar3;
  undefined4 in_stack_fffffffffffffda4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1_00;
  Printer *this;
  EnumDescriptor *in_stack_fffffffffffffdb8;
  Printer *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  Printer *in_stack_fffffffffffffdd0;
  EnumValueDescriptor *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  EnumDescriptor *in_stack_fffffffffffffde8;
  string *in_stack_fffffffffffffdf8;
  string local_200 [32];
  Printer *local_1e0;
  int local_1d4;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  EnumValueDescriptor *local_170;
  int local_164;
  string local_160 [32];
  string local_140 [36];
  int local_11c;
  GeneratorContext *in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffef7;
  undefined4 in_stack_fffffffffffffef8;
  int32 in_stack_fffffffffffffefc;
  FileDescriptor *in_stack_ffffffffffffff00;
  undefined1 local_48 [8];
  long *local_20;
  byte local_11;
  EnumDescriptor *local_10;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  local_11 = in_DL & 1;
  this = (Printer *)&stack0xffffffffffffffc0;
  local_20 = in_RCX;
  local_10 = in_RSI;
  GeneratedClassFileName<google::protobuf::EnumDescriptor>
            (in_stack_fffffffffffffdb8,SUB81((ulong)this >> 0x38,0));
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (**(code **)(*local_20 + 0x10))(local_20,this);
  args_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
  ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
            ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
              *)in_stack_fffffffffffffd60,(pointer)in_stack_fffffffffffffd58);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
         *)in_stack_fffffffffffffd60);
  io::Printer::Printer
            (in_stack_fffffffffffffd70,(ZeroCopyOutputStream *)in_stack_fffffffffffffd68,
             (char)((ulong)in_stack_fffffffffffffd60 >> 0x38));
  GenerateHead((FileDescriptor *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  FilenameToClassname(in_stack_fffffffffffffd98);
  local_11c = std::__cxx11::string::find_last_of(&stack0xfffffffffffffee8,0x7627d6);
  if (local_11c != -1) {
    std::__cxx11::string::substr((ulong)local_140,(ulong)&stack0xfffffffffffffee8);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_fffffffffffffdc0,(char *)args_1,&this->variable_delimiter_,args_1_00);
    std::__cxx11::string::~string(local_140);
    io::Printer::Print<>(this,(char *)args_1_00);
  }
  GenerateEnumDocComment
            ((Printer *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (EnumDescriptor *)in_stack_fffffffffffffd98,iVar3);
  if (local_11c != -1) {
    std::__cxx11::string::substr((ulong)local_160,(ulong)&stack0xfffffffffffffee8);
    std::__cxx11::string::operator=((string *)&stack0xfffffffffffffee8,local_160);
    std::__cxx11::string::~string(local_160);
  }
  io::Printer::Print<char[5],std::__cxx11::string>
            (in_stack_fffffffffffffdc0,(char *)args_1,&this->variable_delimiter_,args_1_00);
  Indent((Printer *)0x4a90de);
  local_164 = 0;
  while( true ) {
    iVar3 = local_164;
    iVar1 = EnumDescriptor::value_count(local_10);
    if (iVar1 <= iVar3) break;
    local_170 = EnumDescriptor::value(local_10,local_164);
    GenerateEnumValueDocComment
              ((Printer *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
    EnumValueDescriptor::name_abi_cxx11_(local_170);
    ConstantNamePrefix(in_stack_fffffffffffffdf8);
    EnumValueDescriptor::name_abi_cxx11_(local_170);
    std::operator+(in_stack_fffffffffffffd68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd60);
    EnumValueDescriptor::number(local_170);
    IntToString_abi_cxx11_(in_stack_fffffffffffffefc);
    io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               &in_stack_fffffffffffffdc0->variable_delimiter_,args_1,&this->variable_delimiter_,
               args_1_00);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string(local_1b0);
    local_164 = local_164 + 1;
  }
  io::Printer::Print<>(this,(char *)args_1_00);
  Indent((Printer *)0x4a92d6);
  local_1d4 = 0;
  while( true ) {
    iVar3 = local_1d4;
    iVar1 = EnumDescriptor::value_count(local_10);
    if (iVar1 <= iVar3) break;
    in_stack_fffffffffffffd70 = (Printer *)EnumDescriptor::value(local_10,local_1d4);
    local_1e0 = in_stack_fffffffffffffd70;
    __lhs = EnumValueDescriptor::name_abi_cxx11_((EnumValueDescriptor *)in_stack_fffffffffffffd70);
    ConstantNamePrefix(in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffd60 =
         (Printer *)EnumValueDescriptor::name_abi_cxx11_((EnumValueDescriptor *)local_1e0);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffd60);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_fffffffffffffdc0,(char *)args_1,&this->variable_delimiter_,args_1_00);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffde0);
    local_1d4 = local_1d4 + 1;
  }
  Outdent((Printer *)0x4a943c);
  io::Printer::Print<>(this,(char *)args_1_00);
  io::Printer::Print<>(this,(char *)args_1_00);
  Indent((Printer *)0x4a9477);
  io::Printer::Print<>(this,(char *)args_1_00);
  Indent((Printer *)0x4a949c);
  io::Printer::Print<>(this,(char *)args_1_00);
  Indent((Printer *)0x4a94c1);
  Indent((Printer *)0x4a94d0);
  io::Printer::Print<>(this,(char *)args_1_00);
  Outdent((Printer *)0x4a94f5);
  Outdent((Printer *)0x4a9504);
  Outdent((Printer *)0x4a9513);
  io::Printer::Print<>(this,(char *)args_1_00);
  Outdent((Printer *)0x4a9538);
  io::Printer::Print<>(this,(char *)args_1_00);
  io::Printer::Print<>(this,(char *)args_1_00);
  Indent((Printer *)0x4a9573);
  io::Printer::Print<>(this,(char *)args_1_00);
  Indent((Printer *)0x4a9598);
  io::Printer::Print<>(this,(char *)args_1_00);
  Indent((Printer *)0x4a95bd);
  Indent((Printer *)0x4a95cc);
  io::Printer::Print<>(this,(char *)args_1_00);
  Outdent((Printer *)0x4a95f1);
  Outdent((Printer *)0x4a9600);
  Outdent((Printer *)0x4a960f);
  io::Printer::Print<>(this,(char *)args_1_00);
  Outdent((Printer *)0x4a9634);
  io::Printer::Print<>(this,(char *)args_1_00);
  Outdent((Printer *)0x4a9659);
  io::Printer::Print<>(this,(char *)args_1_00);
  pDVar2 = EnumDescriptor::containing_type(local_10);
  if (pDVar2 != (Descriptor *)0x0) {
    io::Printer::Print<>(this,(char *)args_1_00);
    LegacyFullClassName<google::protobuf::EnumDescriptor>
              (in_stack_fffffffffffffde8,(bool)in_stack_fffffffffffffde7);
    io::Printer::Print<char[4],std::__cxx11::string,char[4],std::__cxx11::string>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               &in_stack_fffffffffffffdc0->variable_delimiter_,args_1,&this->variable_delimiter_,
               args_1_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
    LegacyGenerateClassFile<google::protobuf::EnumDescriptor>
              (in_stack_ffffffffffffff00,
               (EnumDescriptor *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (bool)in_stack_fffffffffffffef7,in_stack_fffffffffffffee8);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  io::Printer::~Printer(in_stack_fffffffffffffd60);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 *)in_stack_fffffffffffffd70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void GenerateEnumFile(const FileDescriptor* file, const EnumDescriptor* en,
                      bool is_descriptor, GeneratorContext* generator_context) {
  std::string filename = GeneratedClassFileName(en, is_descriptor);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));

    // We only need this 'use' statement if the enum has a namespace.
    // Otherwise, we get a warning that the use statement has no effect.
    printer.Print("use UnexpectedValueException;\n\n");
  }

  GenerateEnumDocComment(&printer, en, is_descriptor);

  if (lastindex != string::npos) {
    fullname = fullname.substr(lastindex + 1);
  }

  printer.Print(
      "class ^name^\n"
      "{\n",
      "name", fullname);
  Indent(&printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    GenerateEnumValueDocComment(&printer, value);
    printer.Print("const ^name^ = ^number^;\n",
                  "name", ConstantNamePrefix(value->name()) + value->name(),
                  "number", IntToString(value->number()));
  }

  printer.Print("\nprivate static $valueToName = [\n");
  Indent(&printer);
  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer.Print("self::^name^ => '^name^',\n",
                  "name", ConstantNamePrefix(value->name()) + value->name());
  }
  Outdent(&printer);
  printer.Print("];\n");

  printer.Print(
      "\npublic static function name($value)\n"
      "{\n");
  Indent(&printer);
  printer.Print("if (!isset(self::$valueToName[$value])) {\n");
  Indent(&printer);
  printer.Print("throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  printer.Print("'Enum %s has no name defined for value %s', __CLASS__, $value));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  printer.Print("}\n"
                "return self::$valueToName[$value];\n");
  Outdent(&printer);
  printer.Print("}\n\n");

  printer.Print(
      "\npublic static function value($name)\n"
      "{\n");
  Indent(&printer);
  printer.Print("$const = __CLASS__ . '::' . strtoupper($name);\n"
                "if (!defined($const)) {\n");
  Indent(&printer);
  printer.Print("throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  printer.Print("'Enum %s has no value defined for name %s', __CLASS__, $name));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  printer.Print("}\n"
                "return constant($const);\n");
  Outdent(&printer);
  printer.Print("}\n");

  Outdent(&printer);
  printer.Print("}\n\n");

  // write legacy file for backwards compatiblity with nested messages and enums
  if (en->containing_type() != NULL) {
    printer.Print(
        "// Adding a class alias for backwards compatibility with the previous class name.\n");
    printer.Print(
        "class_alias(^new^::class, \\^old^::class);\n\n",
        "new", fullname,
        "old", LegacyFullClassName(en, is_descriptor));
    LegacyGenerateClassFile(file, en, is_descriptor, generator_context);
  }
}